

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bv.c
# Opt level: O0

int bv_put_bits(bv_t *bv,unsigned_long bits,uint numbits)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  byte local_54;
  byte local_44;
  uint local_34;
  uint lastbits;
  uint i;
  uint len;
  uint overflow;
  uint cidx;
  uint numbits_local;
  unsigned_long bits_local;
  bv_t *bv_local;
  
  if (bv == (bv_t *)0x0) {
    __assert_fail("bv != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",
                  0x7e,"int bv_put_bits(bv_t *, unsigned long, unsigned int)");
  }
  if (bv->data != (uchar *)0x0) {
    if (bv->idx < bv->len) {
      if (bv->len - bv->idx < numbits) {
        bv_local._4_4_ = 0;
      }
      else {
        len = bv->idx >> 3;
        uVar3 = bv->idx & 7;
        bv->idx = numbits + bv->idx;
        cVar1 = (char)numbits;
        _cidx = bits << (0x20U - cVar1 & 0x3f);
        cVar2 = (char)uVar3;
        if (uVar3 + numbits < 8) {
          if (8 - uVar3 == numbits) {
            local_44 = 0;
          }
          else {
            local_44 = bv->data[len] & (char)(2 << ((-cVar1 - cVar2) + 7U & 0x1f)) - 1U;
          }
          bv->data[len] =
               (byte)(((int)(uint)bv->data[len] >> (8U - cVar2 & 0x1f)) << (8U - cVar2 & 0x1f)) |
               (byte)(((_cidx >> 0x18 & 0xff) >> (8U - cVar1 & 0x3f)) <<
                     (('\b' - cVar2) - cVar1 & 0x3fU)) | local_44;
          bv_local._4_4_ = 1;
        }
        else {
          bv->data[len] =
               (byte)(((int)(uint)bv->data[len] >> (8U - cVar2 & 0x1f)) << (8U - cVar2 & 0x1f)) |
               (byte)((_cidx >> 0x18 & 0xff) >> (8U - ('\b' - cVar2) & 0x3f));
          _cidx = _cidx << (8U - cVar2 & 0x3f);
          for (local_34 = 1; len = len + 1, local_34 < numbits + uVar3 >> 3; local_34 = local_34 + 1
              ) {
            bv->data[len] = (uchar)(_cidx >> 0x18);
            _cidx = _cidx << 8;
          }
          uVar3 = uVar3 + numbits & 7;
          cVar2 = (char)uVar3;
          if (uVar3 == 8) {
            local_54 = 0;
          }
          else {
            local_54 = bv->data[len] & (char)(2 << (7U - cVar2 & 0x1f)) - 1U;
          }
          bv->data[len] =
               (byte)(((_cidx >> 0x18 & 0xff) >> (8U - cVar2 & 0x3f)) << (8U - cVar2 & 0x3f)) |
               local_54;
          bv_local._4_4_ = 1;
        }
      }
      return bv_local._4_4_;
    }
    __assert_fail("bv->len > bv->idx",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",0x80,
                  "int bv_put_bits(bv_t *, unsigned long, unsigned int)");
  }
  __assert_fail("bv->data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",0x7f,
                "int bv_put_bits(bv_t *, unsigned long, unsigned int)");
}

Assistant:

int bv_put_bits(bv_t *bv, unsigned long bits, unsigned int numbits) {
  assert(bv != NULL);
  assert(bv->data != NULL);
  assert(bv->len > bv->idx);
  assert((numbits <= 32) ||
         "Can not write more than 32 bits into a bit vector");

  if (numbits > (bv->len - bv->idx))
    return 0;

  unsigned int cidx = bv->idx >> 3;
  unsigned int overflow = bv->idx & 0x07;

  bv->idx += numbits;
  /*M
    Put first bit as highest order bit of 32 bit long.
  **/
  bits <<= (32 - numbits);

  if ((overflow + numbits) < 8) {
    bv->data[cidx] =
      (HIGHERBITS(bv->data[cidx], overflow) << (8 - overflow)) |
      (HIGHERBITS(bits >> 24, numbits) << (8 - overflow - numbits)) |
      LOWERBITS(bv->data[cidx], 8 - overflow - numbits);
    return 1;
  } else {
    bv->data[cidx] =
      (HIGHERBITS(bv->data[cidx], overflow) << (8 - overflow)) |
      HIGHERBITS(bits >> 24, 8 - overflow);
  }
  cidx++;
  bits <<= 8 - overflow;

  unsigned int len = ((numbits + overflow) >> 3) + 1;
  unsigned int i;
  for (i = 1; i < len - 1; i++, bits <<= 8)
    bv->data[cidx++] = (bits >> 24) & 0xff;

  unsigned int lastbits = (overflow + numbits) & 0x07;
  bv->data[cidx] =
    (HIGHERBITS((bits >> 24) & 0xff, lastbits) << (8 - lastbits)) |
    LOWERBITS(bv->data[cidx], 8 - lastbits);

  return 1;
}